

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_avx2.c
# Opt level: O2

uint64_t av1_wedge_sse_from_residuals_avx2(int16_t *r1,int16_t *d,uint8_t *m,int N)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  undefined1 (*pauVar7) [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  
  lVar5 = (long)-N;
  pauVar7 = (undefined1 (*) [32])(r1 + N + lVar5);
  pauVar6 = (undefined1 (*) [32])(d + N + lVar5);
  auVar8._8_2_ = 0x40;
  auVar8._0_8_ = 0x40004000400040;
  auVar8._10_2_ = 0x40;
  auVar8._12_2_ = 0x40;
  auVar8._14_2_ = 0x40;
  auVar8._16_2_ = 0x40;
  auVar8._18_2_ = 0x40;
  auVar8._20_2_ = 0x40;
  auVar8._22_2_ = 0x40;
  auVar8._24_2_ = 0x40;
  auVar8._26_2_ = 0x40;
  auVar8._28_2_ = 0x40;
  auVar8._30_2_ = 0x40;
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar10 = vlddqu_avx(*pauVar7);
    auVar2 = vlddqu_avx(*pauVar6);
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(m + lVar5 + N));
    auVar4 = vpunpcklwd_avx2(auVar2,auVar10);
    auVar3 = vpunpckhwd_avx2(auVar2,auVar10);
    auVar2 = vpmovzxbw_avx2(auVar1);
    auVar10 = vpunpcklwd_avx2(auVar2,auVar8);
    auVar10 = vpmaddwd_avx2(auVar4,auVar10);
    auVar2 = vpunpckhwd_avx2(auVar2,auVar8);
    auVar2 = vpmaddwd_avx2(auVar3,auVar2);
    auVar10 = vpackssdw_avx2(auVar10,auVar2);
    auVar10 = vpmaddwd_avx2(auVar10,auVar10);
    auVar2 = vpblendd_avx2(auVar10,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
    auVar10 = vpsrlq_avx2(auVar10,0x20);
    auVar10 = vpaddq_avx2(auVar10,auVar9._0_32_);
    auVar10 = vpaddq_avx2(auVar10,auVar2);
    auVar9 = ZEXT3264(auVar10);
    pauVar7 = pauVar7 + 1;
    pauVar6 = pauVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0);
  auVar8 = vpsrldq_avx2(auVar10,8);
  auVar8 = vpaddq_avx2(auVar10,auVar8);
  auVar1 = vpaddq_avx(auVar8._0_16_,auVar8._16_16_);
  return auVar1._0_8_ + 0x800U >> 0xc;
}

Assistant:

uint64_t av1_wedge_sse_from_residuals_avx2(const int16_t *r1, const int16_t *d,
                                           const uint8_t *m, int N) {
  int n = -N;

  uint64_t csse;

  const __m256i v_mask_max_w = _mm256_set1_epi16(MAX_MASK_VALUE);
  const __m256i v_zext_q = _mm256_set1_epi64x(~0u);

  __m256i v_acc0_q = _mm256_setzero_si256();

  assert(N % 64 == 0);

  r1 += N;
  d += N;
  m += N;

  do {
    const __m256i v_r0_w = _mm256_lddqu_si256((__m256i *)(r1 + n));
    const __m256i v_d0_w = _mm256_lddqu_si256((__m256i *)(d + n));
    const __m128i v_m01_b = _mm_lddqu_si128((__m128i *)(m + n));

    const __m256i v_rd0l_w = _mm256_unpacklo_epi16(v_d0_w, v_r0_w);
    const __m256i v_rd0h_w = _mm256_unpackhi_epi16(v_d0_w, v_r0_w);
    const __m256i v_m0_w = _mm256_cvtepu8_epi16(v_m01_b);

    const __m256i v_m0l_w = _mm256_unpacklo_epi16(v_m0_w, v_mask_max_w);
    const __m256i v_m0h_w = _mm256_unpackhi_epi16(v_m0_w, v_mask_max_w);

    const __m256i v_t0l_d = _mm256_madd_epi16(v_rd0l_w, v_m0l_w);
    const __m256i v_t0h_d = _mm256_madd_epi16(v_rd0h_w, v_m0h_w);

    const __m256i v_t0_w = _mm256_packs_epi32(v_t0l_d, v_t0h_d);

    const __m256i v_sq0_d = _mm256_madd_epi16(v_t0_w, v_t0_w);

    const __m256i v_sum0_q = _mm256_add_epi64(
        _mm256_and_si256(v_sq0_d, v_zext_q), _mm256_srli_epi64(v_sq0_d, 32));

    v_acc0_q = _mm256_add_epi64(v_acc0_q, v_sum0_q);

    n += 16;
  } while (n);

  v_acc0_q = _mm256_add_epi64(v_acc0_q, _mm256_srli_si256(v_acc0_q, 8));
  __m128i v_acc_q_0 = _mm256_castsi256_si128(v_acc0_q);
  __m128i v_acc_q_1 = _mm256_extracti128_si256(v_acc0_q, 1);
  v_acc_q_0 = _mm_add_epi64(v_acc_q_0, v_acc_q_1);
#if AOM_ARCH_X86_64
  csse = (uint64_t)_mm_extract_epi64(v_acc_q_0, 0);
#else
  xx_storel_64(&csse, v_acc_q_0);
#endif

  return ROUND_POWER_OF_TWO(csse, 2 * WEDGE_WEIGHT_BITS);
}